

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

ValidationResults *
google::protobuf::FeatureResolver::ValidateFeatureLifetimes
          (ValidationResults *__return_storage_ptr__,Edition edition,FeatureSet *features,
          Descriptor *pool_descriptor)

{
  MessageLite *this;
  FeatureSet *this_00;
  string_view data;
  DynamicMessageFactory factory;
  string local_80;
  DynamicMessageFactory local_60;
  
  DynamicMessageFactory::DynamicMessageFactory(&local_60);
  if (pool_descriptor == (Descriptor *)0x0) {
    this_00 = (FeatureSet *)0x0;
  }
  else {
    this = &DynamicMessageFactory::GetPrototype(&local_60,pool_descriptor)->super_MessageLite;
    this_00 = (FeatureSet *)MessageLite::New(this,(Arena *)0x0);
    MessageLite::SerializeAsString_abi_cxx11_(&local_80,(MessageLite *)features);
    data._M_str = local_80._M_dataplus._M_p;
    data._M_len = local_80._M_string_length;
    MessageLite::ParseFromString((MessageLite *)this_00,data);
    features = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  anon_unknown_21::ValidateFeatureLifetimesImpl
            (edition,&features->super_Message,__return_storage_ptr__);
  if (this_00 != (FeatureSet *)0x0) {
    (*(this_00->super_Message).super_MessageLite._vptr_MessageLite[1])(this_00);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&local_60);
  return __return_storage_ptr__;
}

Assistant:

FeatureResolver::ValidationResults FeatureResolver::ValidateFeatureLifetimes(
    Edition edition, const FeatureSet& features,
    const Descriptor* pool_descriptor) {
  const Message* pool_features = nullptr;
  DynamicMessageFactory factory;
  std::unique_ptr<Message> features_storage;
  if (pool_descriptor == nullptr) {
    // The FeatureSet descriptor can be null if no custom extensions are defined
    // in any transitive dependency.  In this case, we can just use the
    // generated pool for validation, since there wouldn't be any feature
    // extensions defined anyway.
    pool_features = &features;
  } else {
    // Move the features back to the current pool so that we can reflect on any
    // extensions.
    features_storage =
        absl::WrapUnique(factory.GetPrototype(pool_descriptor)->New());
    features_storage->ParseFromString(features.SerializeAsString());
    pool_features = features_storage.get();
  }
  ABSL_CHECK(pool_features != nullptr);

  ValidationResults results;
  ValidateFeatureLifetimesImpl(edition, *pool_features, results);
  return results;
}